

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O1

int res(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector resval,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = *user_data;
  pdVar5 = *(double **)((long)yy->content + 0x10);
  dVar2 = *pdVar5;
  pdVar6 = *(double **)((long)yp->content + 0x10);
  dVar3 = pdVar6[1];
  pdVar7 = *(double **)((long)resval->content + 0x10);
  dVar8 = pdVar5[1];
  dVar9 = pdVar5[2];
  dVar10 = *(double *)((long)user_data + 8) * dVar8;
  dVar4 = *(double *)((long)user_data + 0x10);
  *pdVar7 = -dVar10 * dVar9 + *pdVar6 + dVar2 * dVar1;
  pdVar7[1] = dVar4 * dVar8 * dVar8 + (dVar3 - dVar1 * dVar2) + dVar9 * dVar10;
  pdVar7[2] = dVar9 + dVar2 + dVar8 + -1.0;
  return 0;
}

Assistant:

static int res(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector resval,
               void* user_data)
{
  UserData data;
  sunrealtype p1, p2, p3;
  sunrealtype y1, y2, y3;
  sunrealtype yp1, yp2;

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  yp1 = Ith(yp, 1);
  yp2 = Ith(yp, 2);

  Ith(resval, 1) = yp1 + p1 * y1 - p2 * y2 * y3;
  Ith(resval, 2) = yp2 - p1 * y1 + p2 * y2 * y3 + p3 * y2 * y2;
  Ith(resval, 3) = y1 + y2 + y3 - ONE;

  return (0);
}